

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

void rw::xbox::defaultInstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  uint uVar1;
  uint32 uVar2;
  bool32 bVar3;
  uint32 *puVar4;
  uint8 *puVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  puVar4 = getVertexFmt(geo);
  if (*puVar4 == 0) {
    uVar2 = makeVertexFmt(geo->flags,geo->numTexCoordSets);
    *puVar4 = uVar2;
  }
  uVar2 = getVertexFmtStride(*puVar4);
  header->stride = uVar2;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp line: 322"
  ;
  puVar5 = (uint8 *)(*DAT_00149da8)((long)(int)uVar2 * (long)header->numVertices,0x3000f);
  header->vertexBuffer = puVar5;
  uVar1 = *puVar4;
  uVar8 = (ulong)(uVar1 & 0xf);
  instV3d(*(int *)(v3dFormatMap + uVar8 * 4),puVar5,geo->morphTargets->vertices,header->numVertices,
          header->stride);
  uVar6 = 4;
  if (uVar8 != 4) {
    uVar6 = (ulong)(uint)(*(int *)(vertexFormatSizes + uVar8 * 4) * 3);
  }
  puVar5 = puVar5 + uVar6;
  uVar7 = uVar1 >> 4 & 0xf;
  if ((uVar1 >> 4 & 0xf) != 0) {
    instV3d(*(int *)(v3dFormatMap + (ulong)uVar7 * 4),puVar5,geo->morphTargets->normals,
            header->numVertices,header->stride);
    uVar6 = 4;
    if (uVar7 != 4) {
      uVar6 = (ulong)(uint)(*(int *)(vertexFormatSizes + (ulong)uVar7 * 4) * 3);
    }
    puVar5 = puVar5 + uVar6;
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    bVar3 = instColor(10,puVar5,geo->colors,header->numVertices,header->stride);
    header->vertexAlpha = bVar3;
    puVar5 = puVar5 + 4;
  }
  lVar9 = 0;
  do {
    uVar7 = uVar1 >> ((char)lVar9 + 8U & 0x1f) & 0xf;
    if (uVar7 == 0) {
      return;
    }
    instTexCoords(*(int *)(v2dFormatMap + (ulong)uVar7 * 4),puVar5,
                  *(TexCoords **)((long)geo->texCoords + lVar9 * 2),header->numVertices,
                  header->stride);
    uVar6 = 4;
    if (uVar7 != 4) {
      uVar6 = (ulong)(uint)(*(int *)(vertexFormatSizes + (ulong)uVar7 * 4) * 2);
    }
    puVar5 = puVar5 + uVar6;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x10);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	uint32 *vertexFmt = getVertexFmt(geo);
	if(*vertexFmt == 0)
		*vertexFmt = makeVertexFmt(geo->flags, geo->numTexCoordSets);
	header->stride = getVertexFmtStride(*vertexFmt);
	header->vertexBuffer = rwNewT(uint8, header->stride*header->numVertices, MEMDUR_EVENT | ID_GEOMETRY);
	uint8 *dst = (uint8*)header->vertexBuffer;

	uint32 fmt = *vertexFmt;
	uint32 sel = fmt & 0xF;
	instV3d(v3dFormatMap[sel], dst, geo->morphTargets[0].vertices,
	        header->numVertices, header->stride);
	dst += sel == 4 ? 4 : 3*vertexFormatSizes[sel];

	sel = (fmt >> 4) & 0xF;
	if(sel){
		instV3d(v3dFormatMap[sel], dst, geo->morphTargets[0].normals,
		        header->numVertices, header->stride);
		dst += sel == 4 ? 4 : 3*vertexFormatSizes[sel];
	}

	if(fmt & 0x1000000){
		header->vertexAlpha = instColor(VERT_ARGB, dst, geo->colors,
		                                header->numVertices, header->stride);
		dst += 4;
	}

	for(int i = 0; i < 4; i++){
		sel = (fmt >> (i*4 + 8)) & 0xF;
		if(sel == 0)
			break;
		instTexCoords(v2dFormatMap[sel], dst, geo->texCoords[i],
		        header->numVertices, header->stride);
		dst += sel == 4 ? 4 : 2*vertexFormatSizes[sel];
	}

	if(fmt & 0xE000000)
		assert(0 && "can't instance tangents or whatever it is");
}